

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXCount.cpp
# Opt level: O3

int main(int argC,char **argV)

{
  uint uVar1;
  int iVar2;
  undefined7 uVar6;
  ostream *poVar3;
  SAXParser *this;
  undefined8 uVar4;
  size_t sVar5;
  MemoryManager *pMVar7;
  bool bVar8;
  ostream *poVar9;
  char *pcVar10;
  char *pcVar11;
  SAXCountHandlers handler;
  char localeStr [64];
  ifstream fin;
  char fURI [1000];
  undefined1 auStack_6d8 [4];
  uint local_6d4;
  uint local_6d0;
  undefined4 local_6cc;
  undefined4 local_6c8;
  uint local_6c4;
  ostream *local_6c0;
  SAXCountHandlers local_6b0;
  char local_668 [72];
  long local_620 [4];
  byte abStack_600 [488];
  char local_418 [1000];
  
  if (1 < argC) {
    poVar3 = (ostream *)(ulong)(uint)argC;
    pcVar11 = local_668;
    local_668[0x30] = '\0';
    local_668[0x31] = '\0';
    local_668[0x32] = '\0';
    local_668[0x33] = '\0';
    local_668[0x34] = '\0';
    local_668[0x35] = '\0';
    local_668[0x36] = '\0';
    local_668[0x37] = '\0';
    local_668[0x38] = '\0';
    local_668[0x39] = '\0';
    local_668[0x3a] = '\0';
    local_668[0x3b] = '\0';
    local_668[0x3c] = '\0';
    local_668[0x3d] = '\0';
    local_668[0x3e] = '\0';
    local_668[0x3f] = '\0';
    local_668[0x20] = '\0';
    local_668[0x21] = '\0';
    local_668[0x22] = '\0';
    local_668[0x23] = '\0';
    local_668[0x24] = '\0';
    local_668[0x25] = '\0';
    local_668[0x26] = '\0';
    local_668[0x27] = '\0';
    local_668[0x28] = '\0';
    local_668[0x29] = '\0';
    local_668[0x2a] = '\0';
    local_668[0x2b] = '\0';
    local_668[0x2c] = '\0';
    local_668[0x2d] = '\0';
    local_668[0x2e] = '\0';
    local_668[0x2f] = '\0';
    local_668[0x10] = '\0';
    local_668[0x11] = '\0';
    local_668[0x12] = '\0';
    local_668[0x13] = '\0';
    local_668[0x14] = '\0';
    local_668[0x15] = '\0';
    local_668[0x16] = '\0';
    local_668[0x17] = '\0';
    local_668[0x18] = '\0';
    local_668[0x19] = '\0';
    local_668[0x1a] = '\0';
    local_668[0x1b] = '\0';
    local_668[0x1c] = '\0';
    local_668[0x1d] = '\0';
    local_668[0x1e] = '\0';
    local_668[0x1f] = '\0';
    local_668[0] = '\0';
    local_668[1] = '\0';
    local_668[2] = '\0';
    local_668[3] = '\0';
    local_668[4] = '\0';
    local_668[5] = '\0';
    local_668[6] = '\0';
    local_668[7] = '\0';
    local_668[8] = '\0';
    local_668[9] = '\0';
    local_668[10] = '\0';
    local_668[0xb] = '\0';
    local_668[0xc] = '\0';
    local_668[0xd] = '\0';
    local_668[0xe] = '\0';
    local_668[0xf] = '\0';
    poVar9 = (ostream *)0x1;
    local_6d4 = 0;
    local_6c8 = 0;
    local_6cc = 0;
    local_6d0 = 0;
    local_6c4 = 0;
    local_6c0 = poVar3;
    do {
      pcVar10 = argV[(long)poVar9];
      if (*pcVar10 != '-') {
        if ((int)local_6c0 != (int)poVar9) {
          if (local_668[0] == '\0') {
            pcVar11 = (char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale;
          }
          pMVar7 = (MemoryManager *)0x0;
          xercesc_4_0::XMLPlatformUtils::Initialize
                    (pcVar11,(char *)0x0,(PanicHandler *)0x0,(MemoryManager *)0x0);
          if ((local_6c4 & 1) != 0) {
            pMVar7 = xercesc_4_0::XMLPlatformUtils::fgMemoryManager;
            xercesc_4_0::XMLPlatformUtils::recognizeNEL
                      (true,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          }
          this = (SAXParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0x108,(ulong)pMVar7);
          xercesc_4_0::SAXParser::SAXParser
                    (this,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
                     (XMLGrammarPool *)0x0);
          xercesc_4_0::SAXParser::setValidationScheme((ValSchemes)this);
          bVar8 = SUB81(this,0);
          xercesc_4_0::SAXParser::setDoNamespaces(bVar8);
          xercesc_4_0::SAXParser::setDoSchema(bVar8);
          xercesc_4_0::SAXParser::setHandleMultipleImports(bVar8);
          xercesc_4_0::SAXParser::setValidationSchemaFullChecking(bVar8);
          SAXCountHandlers::SAXCountHandlers(&local_6b0);
          (**(code **)(*(long *)this + 0x20))
                    (this,&local_6b0.super_HandlerBase.super_DocumentHandler);
          (**(code **)(*(long *)this + 0x28))(this);
          std::ifstream::ifstream(local_620);
          if ((local_6d0 & 1) != 0) {
            std::ifstream::open((char *)local_620,(_Ios_Openmode)argV[(long)poVar9]);
          }
          if ((abStack_600[*(long *)(local_620[0] + -0x18)] & 5) == 0) {
            local_6d4 = 0;
            goto LAB_00103842;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Cannot open the list file: ",0x1b);
          pcVar11 = argV[(long)poVar9];
          if (pcVar11 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x109188);
          }
          else {
            sVar5 = strlen(pcVar11);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar11,sVar5);
          }
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x78);
          std::ostream::put(-0x78);
          iVar2 = 2;
          std::ostream::flush();
          goto LAB_00103cda;
        }
        break;
      }
      if ((pcVar10[1] == '?') && (pcVar10[2] == '\0')) {
        usage();
        return 2;
      }
      if (((pcVar10[1] == 'v') && (pcVar10[2] == '=')) ||
         ((pcVar10[1] == 'V' && (pcVar10[2] == '=')))) {
        pcVar10 = pcVar10 + 3;
        uVar1 = strcmp(pcVar10,"never");
        poVar3 = (ostream *)(ulong)uVar1;
        if (uVar1 != 0) {
          uVar1 = strcmp(pcVar10,"auto");
          poVar3 = (ostream *)(ulong)uVar1;
          if (uVar1 != 0) {
            uVar1 = strcmp(pcVar10,"always");
            poVar3 = (ostream *)(ulong)uVar1;
            if (uVar1 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Unknown -v= value: ",0x13);
              sVar5 = strlen(pcVar10);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,pcVar10,sVar5);
              std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x78);
              std::ostream::put(-0x78);
              std::ostream::flush();
              return 2;
            }
          }
        }
      }
      else {
        uVar6 = (undefined7)((ulong)poVar3 >> 8);
        if (((pcVar10[1] == 'n') && (pcVar10[2] == '\0')) ||
           ((pcVar10[1] == 'N' && (pcVar10[2] == '\0')))) {
          poVar3 = (ostream *)CONCAT71(uVar6,1);
          local_6d4 = (uint)poVar3;
        }
        else if (((pcVar10[1] == 's') && (pcVar10[2] == '\0')) ||
                ((pcVar10[1] == 'S' && (pcVar10[2] == '\0')))) {
          poVar3 = (ostream *)CONCAT71(uVar6,1);
          local_6c8 = SUB84(poVar3,0);
        }
        else if (((pcVar10[1] == 'f') && (pcVar10[2] == '\0')) ||
                ((pcVar10[1] == 'F' && (pcVar10[2] == '\0')))) {
          poVar3 = (ostream *)CONCAT71(uVar6,1);
          local_6cc = SUB84(poVar3,0);
        }
        else if (((pcVar10[1] == 'l') && (pcVar10[2] == '\0')) ||
                ((pcVar10[1] == 'L' && (pcVar10[2] == '\0')))) {
          poVar3 = (ostream *)CONCAT71(uVar6,1);
          local_6d0 = (uint)poVar3;
        }
        else {
          iVar2 = strcmp(pcVar10,"-special:nel");
          if (iVar2 == 0) {
            poVar3 = (ostream *)0x0;
            local_6c4 = 1;
          }
          else {
            iVar2 = strncmp(pcVar10,"-locale=",8);
            if (iVar2 == 0) {
              poVar3 = (ostream *)strcpy(pcVar11,pcVar10 + 8);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Unknown option \'",0x10);
              poVar3 = std::operator<<((ostream *)&std::cerr,argV[(long)poVar9]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\', ignoring it\n",0xf);
              poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
            }
          }
        }
      }
      poVar9 = poVar9 + 1;
    } while (local_6c0 != poVar9);
  }
  usage();
  return 1;
LAB_00103842:
  memset(local_418,0,1000);
  if ((local_6d0 & 1) == 0) {
    iVar2 = (int)poVar9;
    if (iVar2 < (int)local_6c0) {
      pcVar11 = argV[iVar2];
      poVar9 = (ostream *)(ulong)(iVar2 + 1);
      goto LAB_00103942;
    }
  }
  else {
    if ((abStack_600[*(long *)(local_620[0] + -0x18)] & 2) == 0) goto code_r0x0010387b;
    std::ifstream::close();
  }
  goto LAB_00103cc1;
code_r0x0010387b:
  std::ios::widen((char)auStack_6d8 + (char)*(long *)(local_620[0] + -0x18) + -0x48);
  std::istream::getline((char *)local_620,(long)local_418,-0x18);
  if (local_418[0] != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"==Parsing== ",0xc);
    sVar5 = strlen(local_418);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_418,sVar5);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
    pcVar11 = local_418;
LAB_00103942:
    SAXCountHandlers::resetErrors(&local_6b0);
    xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
    (**(code **)(*(long *)this + 0x40))(this);
    uVar4 = xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
    if (local_6b0.fSawErrors == false) {
      if (pcVar11 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x109088);
      }
      else {
        sVar5 = strlen(pcVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ms (",5);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," elems, ",8);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," attrs, ",8);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," spaces, ",9);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," chars)",7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    else {
      local_6d4 = (uint)CONCAT71((int7)((ulong)uVar4 >> 8),1);
    }
  }
  goto LAB_00103842;
LAB_00103cc1:
  (**(code **)(*(long *)this + 8))(this);
  xercesc_4_0::XMLPlatformUtils::Terminate();
  iVar2 = (local_6d4 & 1) << 2;
LAB_00103cda:
  std::ifstream::~ifstream(local_620);
  SAXCountHandlers::~SAXCountHandlers(&local_6b0);
  return iVar2;
}

Assistant:

int main(int argC, char* argV[])
{

    // Check command line and extract arguments.
    if (argC < 2)
    {
        usage();
        return 1;
    }

    const char*              xmlFile = 0;
    SAXParser::ValSchemes    valScheme = SAXParser::Val_Auto;
    bool                     doNamespaces       = false;
    bool                     doSchema           = false;
    bool                     schemaFullChecking = false;
    bool                     doList = false;
    bool                     errorOccurred = false;
    bool                     recognizeNEL = false;
    char                     localeStr[64];
    memset(localeStr, 0, sizeof localeStr);

    int argInd;
    for (argInd = 1; argInd < argC; argInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[argInd][0] != '-')
            break;

        // Watch for special case help request
        if (!strcmp(argV[argInd], "-?"))
        {
            usage();
            return 2;
        }
         else if (!strncmp(argV[argInd], "-v=", 3)
              ||  !strncmp(argV[argInd], "-V=", 3))
        {
            const char* const parm = &argV[argInd][3];

            if (!strcmp(parm, "never"))
                valScheme = SAXParser::Val_Never;
            else if (!strcmp(parm, "auto"))
                valScheme = SAXParser::Val_Auto;
            else if (!strcmp(parm, "always"))
                valScheme = SAXParser::Val_Always;
            else
            {
                std::cerr << "Unknown -v= value: " << parm << std::endl;
                return 2;
            }
        }
         else if (!strcmp(argV[argInd], "-n")
              ||  !strcmp(argV[argInd], "-N"))
        {
            doNamespaces = true;
        }
         else if (!strcmp(argV[argInd], "-s")
              ||  !strcmp(argV[argInd], "-S"))
        {
            doSchema = true;
        }
         else if (!strcmp(argV[argInd], "-f")
              ||  !strcmp(argV[argInd], "-F"))
        {
            schemaFullChecking = true;
        }
         else if (!strcmp(argV[argInd], "-l")
              ||  !strcmp(argV[argInd], "-L"))
        {
            doList = true;
        }
         else if (!strcmp(argV[argInd], "-special:nel"))
        {
            // turning this on will lead to non-standard compliance behaviour
            // it will recognize the unicode character 0x85 as new line character
            // instead of regular character as specified in XML 1.0
            // do not turn this on unless really necessary
             recognizeNEL = true;
        }
         else if (!strncmp(argV[argInd], "-locale=", 8))
        {
             // Get out the end of line
             strcpy(localeStr, &(argV[argInd][8]));
        }
        else
        {
            std::cerr << "Unknown option '" << argV[argInd]
                << "', ignoring it\n" << std::endl;
        }
    }

    //
    //  There should at least one parameter left, and that
    //  should be the file name(s).
    //
    if (argInd == argC)
    {
        usage();
        return 1;
    }

    // Initialize the XML4C2 system
    try
    {
        if (strlen(localeStr))
        {
            XMLPlatformUtils::Initialize(localeStr);
        }
        else
        {
            XMLPlatformUtils::Initialize();
        }

        if (recognizeNEL)
        {
            XMLPlatformUtils::recognizeNEL(recognizeNEL);
        }
    }

    catch (const XMLException& toCatch)
    {
        std::cerr << "Error during initialization! Message:\n"
            << StrX(toCatch.getMessage()) << std::endl;
        return 1;
    }

    //
    //  Create a SAX parser object. Then, according to what we were told on
    //  the command line, set it to validate or not.
    //
    SAXParser* parser = new SAXParser;

    parser->setValidationScheme(valScheme);
    parser->setDoNamespaces(doNamespaces);
    parser->setDoSchema(doSchema);
    parser->setHandleMultipleImports (true);
    parser->setValidationSchemaFullChecking(schemaFullChecking);

    //
    //  Create our SAX handler object and install it on the parser, as the
    //  document and error handler.
    //
    SAXCountHandlers handler;
    parser->setDocumentHandler(&handler);
    parser->setErrorHandler(&handler);


    //
    //  Get the starting time and kick off the parse of the indicated
    //  file. Catch any exceptions that might propogate out of it.
    //
    unsigned long duration;

    std::ifstream fin;

    // the input is a list file
    if (doList)
        fin.open(argV[argInd]);

    if (fin.fail()) {
        std::cerr <<"Cannot open the list file: " << argV[argInd] << std::endl;
        return 2;
    }

    while (true)
    {
        char fURI[1000];
        //initialize the array to zeros
        memset(fURI,0,sizeof(fURI));

        if (doList) {
            if (! fin.eof() ) {
                fin.getline (fURI, sizeof(fURI));
                if (!*fURI)
                    continue;
                else {
                    xmlFile = fURI;
                    std::cerr << "==Parsing== " << xmlFile << std::endl;
                }
            }
            else
                break;
        }
        else {
            if (argInd < argC)
            {
                 xmlFile = argV[argInd];
                 argInd++;
            }
            else
                break;
        }

        //reset error count first
        handler.resetErrors();

        try
        {
            const unsigned long startMillis = XMLPlatformUtils::getCurrentMillis();
            parser->parse(xmlFile);
            const unsigned long endMillis = XMLPlatformUtils::getCurrentMillis();
            duration = endMillis - startMillis;
        }
        catch (const OutOfMemoryException&)
        {
            std::cerr << "OutOfMemoryException" << std::endl;
            errorOccurred = true;
            continue;
        }
        catch (const XMLException& e)
        {
            std::cerr << "\nError during parsing: '" << xmlFile << "'\n"
                << "Exception message is:  \n"
                << StrX(e.getMessage()) << "\n" << std::endl;
            errorOccurred = true;
            continue;
        }

        catch (...)
        {
            std::cerr << "\nUnexpected exception during parsing: '" << xmlFile << "'\n";
            errorOccurred = true;
            continue;
        }


        // Print out the stats that we collected and time taken
        if (!handler.getSawErrors())
        {
            std::cout << xmlFile << ": " << duration << " ms ("
                << handler.getElementCount() << " elems, "
                << handler.getAttrCount() << " attrs, "
                << handler.getSpaceCount() << " spaces, "
                << handler.getCharacterCount() << " chars)" << std::endl;
        }
        else
            errorOccurred = true;
    }

    if (doList)
        fin.close();

    //
    //  Delete the parser itself.  Must be done prior to calling Terminate, below.
    //
    delete parser;

    // And call the termination method
    XMLPlatformUtils::Terminate();

    if (errorOccurred)
        return 4;
    else
        return 0;

}